

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O0

bool __thiscall QSizeGrip::eventFilter(QSizeGrip *this,QObject *o,QEvent *e)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  QEvent *in_RDX;
  QEvent *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000013;
  WidgetAttribute in_stack_00000014;
  QSizeGripPrivate *d;
  WindowStates sizeGripNotVisibleState;
  undefined4 in_stack_ffffffffffffffa8;
  WindowState in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool local_21;
  QFlagsStorageHelper<Qt::WindowState,_4> local_18;
  QFlagsStorage<Qt::WindowState> local_14;
  QEvent *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  d_func((QSizeGrip *)0x681424);
  bVar1 = QWidgetPrivate::isExplicitlyHidden
                    ((QWidgetPrivate *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                    );
  if (!bVar1) {
    TVar3 = QEvent::type(in_RDX);
    if (TVar3 == WindowStateChange) {
      bVar1 = ::operator!=((QObject **)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                           ,(QPointer<QWidget> *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (!bVar1) {
        local_14.i = 0xaaaaaaaa;
        QFlags<Qt::WindowState>::QFlags
                  ((QFlags<Qt::WindowState> *)
                   CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        QFlags<Qt::WindowState>::operator|=((QFlags<Qt::WindowState> *)&local_14,WindowMaximized);
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6814ba);
        QWidget::windowState
                  ((QWidget *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
        local_18.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)
             QFlags<Qt::WindowState>::operator&
                       ((QFlags<Qt::WindowState> *)
                        CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                        (QFlagsStorageHelper<Qt::WindowState,_4>)SUB84(in_RDI,0));
        bVar1 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_18);
        (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,bVar1);
        QWidget::setAttribute((QWidget *)d,in_stack_00000014,in_stack_00000013);
        bVar2 = QObject::eventFilter(in_RDI,local_10);
        goto LAB_0068152b;
      }
    }
  }
  bVar2 = QObject::eventFilter(in_RDI,local_10);
LAB_0068152b:
  local_21 = (bool)(bVar2 & 1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QSizeGrip::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QSizeGrip);
    if (d->isExplicitlyHidden()
        || e->type() != QEvent::WindowStateChange
        || o != d->tlw) {
        return QWidget::eventFilter(o, e);
    }
    Qt::WindowStates sizeGripNotVisibleState = Qt::WindowFullScreen;
    sizeGripNotVisibleState |= Qt::WindowMaximized;
    // Don't show the size grip if the tlw is maximized or in full screen mode.
    setVisible(!(d->tlw->windowState() & sizeGripNotVisibleState));
    setAttribute(Qt::WA_WState_ExplicitShowHide, false);
    return QWidget::eventFilter(o, e);
}